

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O1

SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::strings_internal::
SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *pSVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  string_view sVar6;
  
  if (this->state_ == kLastState) {
    this->state_ = kEndState;
  }
  else {
    pSVar1 = this->splitter_;
    uVar2 = (pSVar1->text_)._M_len;
    pcVar5 = (pSVar1->text_)._M_str;
    sVar6._M_len = (pSVar1->text_)._M_len;
    sVar6._M_str = (pSVar1->text_)._M_str;
    sVar6 = ByChar::Find(&this->delimiter_,sVar6,this->pos_);
    if (sVar6._M_str == pcVar5 + uVar2) {
      this->state_ = kLastState;
    }
    uVar3 = this->pos_;
    if (uVar2 < uVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar3,uVar2);
    }
    pcVar5 = pcVar5 + uVar3;
    uVar4 = (long)sVar6._M_str - (long)pcVar5;
    if (uVar2 - uVar3 < uVar4) {
      uVar4 = uVar2 - uVar3;
    }
    (this->curr_)._M_len = uVar4;
    (this->curr_)._M_str = pcVar5;
    this->pos_ = sVar6._M_len + uVar3 + uVar4;
  }
  return this;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }